

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::emit_glsl_op
          (CompilerMSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t count)

{
  Variant *pVVar1;
  bool bVar2;
  uint32_t uVar3;
  BaseType input_type;
  BaseType BVar4;
  ulong uVar5;
  SPIRExpression *pSVar6;
  mapped_type *pmVar7;
  SPIRType *pSVar8;
  char *pcVar9;
  uint32_t uVar10;
  char (*ts_2) [3];
  uint32_t op2;
  __node_gen_type __node_gen;
  char (*in_stack_ffffffffffffff48) [2];
  uint32_t local_94;
  string local_90;
  string local_70;
  string local_50;
  
  ts_2 = (char (*) [3])args;
  local_94 = id;
  uVar3 = CompilerGLSL::get_integer_width_for_glsl_instruction
                    (&this->super_CompilerGLSL,eop,args,count);
  input_type = to_signed_basetype(uVar3);
  BVar4 = to_unsigned_basetype(uVar3);
  switch(eop) {
  case 2:
    uVar3 = *args;
    pcVar9 = "rint";
    break;
  default:
    goto LAB_0026d1e8;
  case 0x19:
    uVar3 = *args;
    uVar10 = args[1];
    pcVar9 = "atan2";
    goto LAB_0026cfee;
  case 0x20:
    uVar3 = *args;
    pcVar9 = "rsqrt";
    break;
  case 0x22:
    pSVar8 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar3 = pSVar8->columns;
    if (uVar3 == 4) {
      uVar3 = *args;
      pcVar9 = "spvInverse4x4";
    }
    else if (uVar3 == 3) {
      uVar3 = *args;
      pcVar9 = "spvInverse3x3";
    }
    else {
      if (uVar3 != 2) {
        return;
      }
      uVar3 = *args;
      pcVar9 = "spvInverse2x2";
    }
    break;
  case 0x23:
  case 0x33:
    uVar5 = (ulong)args[1];
    if (((uVar5 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                  super_VectorView<spirv_cross::Variant>.buffer_size) &&
        (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                  super_VectorView<spirv_cross::Variant>.ptr, pVVar1[uVar5].type == TypeExpression))
       && (pSVar6 = Variant::get<spirv_cross::SPIRExpression>(pVVar1 + uVar5),
          pSVar6->access_chain == true)) {
      pSVar8 = Compiler::expression_type((Compiler *)this,args[1]);
      bVar2 = Compiler::is_scalar((Compiler *)this,pSVar8);
      if (bVar2) {
        CompilerGLSL::register_call_out_argument(&this->super_CompilerGLSL,args[1]);
        local_90._M_dataplus._M_p =
             (pointer)&(this->super_CompilerGLSL).super_Compiler.forced_temporaries;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_90._M_dataplus._M_p,&local_94);
        pmVar7 = ::std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&(this->super_CompilerGLSL).extra_sub_expressions,&local_94);
        if (*pmVar7 == 0) {
          uVar3 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
          *pmVar7 = uVar3;
        }
        uVar3 = Compiler::get_pointee_type_id((Compiler *)this,(pSVar6->expression_type).id);
        CompilerGLSL::emit_uninitialized_temporary_expression
                  (&this->super_CompilerGLSL,uVar3,*pmVar7);
        pcVar9 = "frexp";
        if (eop == 0x23) {
          pcVar9 = "modf";
        }
        CompilerGLSL::emit_binary_func_op
                  (&this->super_CompilerGLSL,result_type,local_94,*args,*pmVar7,pcVar9);
        CompilerGLSL::to_expression_abi_cxx11_(&local_90,&this->super_CompilerGLSL,args[1],true);
        CompilerGLSL::to_expression_abi_cxx11_(&local_70,&this->super_CompilerGLSL,*pmVar7,true);
        CompilerGLSL::
        statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,&local_90,(char (*) [4])0x2f38c7,&local_70,
                   (char (*) [2])0x2d9bde);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        goto LAB_0026d08f;
      }
    }
    goto LAB_0026d1e8;
  case 0x25:
    pSVar8 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar3 = *args;
    uVar10 = args[1];
    if (*(int *)&(pSVar8->super_IVariant).field_0xc == 0xd) {
      pcVar9 = "fast::min";
      goto LAB_0026cfee;
    }
    goto LAB_0026cf8b;
  case 0x28:
    pSVar8 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar3 = *args;
    uVar10 = args[1];
    if (*(int *)&(pSVar8->super_IVariant).field_0xc == 0xd) {
      pcVar9 = "fast::max";
      goto LAB_0026cfee;
    }
    goto LAB_0026cfe7;
  case 0x2b:
    pSVar8 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar3 = *args;
    uVar10 = args[1];
    op2 = args[2];
    if (*(int *)&(pSVar8->super_IVariant).field_0xc == 0xd) {
      pcVar9 = "fast::clamp";
      goto LAB_0026d170;
    }
    goto LAB_0026d169;
  case 0x36:
    uVar3 = *args;
    pcVar9 = "pack_float_to_snorm4x8";
    break;
  case 0x37:
    uVar3 = *args;
    pcVar9 = "pack_float_to_unorm4x8";
    break;
  case 0x38:
    uVar3 = *args;
    pcVar9 = "pack_float_to_snorm2x16";
    break;
  case 0x39:
    uVar3 = *args;
    pcVar9 = "pack_float_to_unorm2x16";
    break;
  case 0x3a:
    CompilerGLSL::to_expression_abi_cxx11_(&local_70,&this->super_CompilerGLSL,*args,true);
    join<char_const(&)[21],std::__cxx11::string,char_const(&)[3]>
              (&local_90,(spirv_cross *)"as_type<uint>(half2(",(char (*) [21])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2ef9b3,ts_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    bVar2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_90,bVar2,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,id,*args);
    goto LAB_0026d08f;
  case 0x3b:
    uVar3 = *args;
    pcVar9 = "unsupported_GLSLstd450PackDouble2x32";
    break;
  case 0x3c:
    uVar3 = *args;
    pcVar9 = "unpack_snorm2x16_to_float";
    break;
  case 0x3d:
    uVar3 = *args;
    pcVar9 = "unpack_unorm2x16_to_float";
    break;
  case 0x3e:
    CompilerGLSL::to_expression_abi_cxx11_(&local_70,&this->super_CompilerGLSL,*args,true);
    join<char_const(&)[23],std::__cxx11::string,char_const(&)[3]>
              (&local_90,(spirv_cross *)"float2(as_type<half2>(",(char (*) [23])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2ef9b3,ts_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    bVar2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_90,bVar2,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,id,*args);
LAB_0026d08f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return;
    }
    operator_delete(local_90._M_dataplus._M_p);
    return;
  case 0x3f:
    uVar3 = *args;
    pcVar9 = "unpack_snorm4x8_to_float";
    break;
  case 0x40:
    uVar3 = *args;
    pcVar9 = "unpack_unorm4x8_to_float";
    break;
  case 0x41:
    uVar3 = *args;
    pcVar9 = "unsupported_GLSLstd450UnpackDouble2x32";
    break;
  case 0x42:
    pSVar8 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar8->vecsize != 1) {
      eop = 0x42;
      goto LAB_0026d1e8;
    }
    uVar3 = *args;
    pcVar9 = "abs";
    break;
  case 0x43:
    pSVar8 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar8->vecsize == 1) {
      CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                (&local_70,&this->super_CompilerGLSL,*args,true);
      CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                (&local_50,&this->super_CompilerGLSL,args[1],true);
      join<char_const(&)[5],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                (&local_90,(spirv_cross *)"abs(",(char (*) [5])&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f3de6,
                 (char (*) [4])&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2dfe76,
                 in_stack_ffffffffffffff48);
      bVar2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
      if (bVar2) {
        bVar2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
      }
      else {
        bVar2 = false;
      }
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_90,bVar2,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      Compiler::inherit_expression_dependencies((Compiler *)this,id,*args);
      Compiler::inherit_expression_dependencies((Compiler *)this,id,args[1]);
      return;
    }
    eop = 0x43;
    goto LAB_0026d1e8;
  case 0x45:
    pSVar8 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar8->vecsize != 1) {
      eop = 0x45;
      goto LAB_0026d1e8;
    }
    uVar3 = *args;
    pcVar9 = "sign";
    break;
  case 0x46:
    pSVar8 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + result_type);
    if (pSVar8->vecsize == 1) {
      uVar3 = *args;
      uVar10 = args[1];
      op2 = args[2];
      pcVar9 = "spvFaceForward";
      goto LAB_0026d170;
    }
    eop = 0x46;
    goto LAB_0026d1e8;
  case 0x47:
    pSVar8 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + result_type);
    if (pSVar8->vecsize == 1) {
      uVar3 = *args;
      uVar10 = args[1];
      pcVar9 = "spvReflect";
      goto LAB_0026cfee;
    }
    eop = 0x47;
    goto LAB_0026d1e8;
  case 0x48:
    pSVar8 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + result_type);
    if (pSVar8->vecsize == 1) {
      uVar3 = *args;
      uVar10 = args[1];
      op2 = args[2];
      pcVar9 = "spvRefract";
      goto LAB_0026d170;
    }
    eop = 0x48;
LAB_0026d1e8:
    CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,result_type,id,eop,args,count);
    return;
  case 0x49:
    pSVar8 = Compiler::expression_type((Compiler *)this,*args);
    input_type = *(BaseType *)&(pSVar8->super_IVariant).field_0xc;
    uVar3 = *args;
    pcVar9 = "spvFindLSB";
    goto LAB_0026d0fc;
  case 0x4a:
    uVar3 = *args;
    pcVar9 = "spvFindSMSB";
    goto LAB_0026d0fc;
  case 0x4b:
    uVar3 = *args;
    pcVar9 = "spvFindUMSB";
    input_type = BVar4;
LAB_0026d0fc:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,result_type,id,uVar3,pcVar9,input_type,input_type);
    return;
  case 0x4f:
    pSVar8 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar3 = *args;
    uVar10 = args[1];
    if (*(int *)&(pSVar8->super_IVariant).field_0xc == 0xd) {
      pcVar9 = "precise::min";
      goto LAB_0026cfee;
    }
LAB_0026cf8b:
    pcVar9 = "min";
LAB_0026cfee:
    CompilerGLSL::emit_binary_func_op(&this->super_CompilerGLSL,result_type,id,uVar3,uVar10,pcVar9);
    return;
  case 0x50:
    pSVar8 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar3 = *args;
    uVar10 = args[1];
    if (*(int *)&(pSVar8->super_IVariant).field_0xc == 0xd) {
      pcVar9 = "precise::max";
      goto LAB_0026cfee;
    }
LAB_0026cfe7:
    pcVar9 = "max";
    goto LAB_0026cfee;
  case 0x51:
    pSVar8 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar3 = *args;
    uVar10 = args[1];
    op2 = args[2];
    if (*(int *)&(pSVar8->super_IVariant).field_0xc == 0xd) {
      pcVar9 = "precise::clamp";
      goto LAB_0026d170;
    }
LAB_0026d169:
    pcVar9 = "clamp";
LAB_0026d170:
    CompilerGLSL::emit_trinary_func_op
              (&this->super_CompilerGLSL,result_type,id,uVar3,uVar10,op2,pcVar9);
    return;
  }
  CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,result_type,id,uVar3,pcVar9);
  return;
}

Assistant:

void CompilerMSL::emit_glsl_op(uint32_t result_type, uint32_t id, uint32_t eop, const uint32_t *args, uint32_t count)
{
	auto op = static_cast<GLSLstd450>(eop);

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_glsl_instruction(op, args, count);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	switch (op)
	{
	case GLSLstd450Atan2:
		emit_binary_func_op(result_type, id, args[0], args[1], "atan2");
		break;
	case GLSLstd450InverseSqrt:
		emit_unary_func_op(result_type, id, args[0], "rsqrt");
		break;
	case GLSLstd450RoundEven:
		emit_unary_func_op(result_type, id, args[0], "rint");
		break;

	case GLSLstd450FindILsb:
	{
		// In this template version of findLSB, we return T.
		auto basetype = expression_type(args[0]).basetype;
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindLSB", basetype, basetype);
		break;
	}

	case GLSLstd450FindSMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindSMSB", int_type, int_type);
		break;

	case GLSLstd450FindUMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindUMSB", uint_type, uint_type);
		break;

	case GLSLstd450PackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_snorm4x8");
		break;
	case GLSLstd450PackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_unorm4x8");
		break;
	case GLSLstd450PackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_snorm2x16");
		break;
	case GLSLstd450PackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_unorm2x16");
		break;

	case GLSLstd450PackHalf2x16:
	{
		auto expr = join("as_type<uint>(half2(", to_expression(args[0]), "))");
		emit_op(result_type, id, expr, should_forward(args[0]));
		inherit_expression_dependencies(id, args[0]);
		break;
	}

	case GLSLstd450UnpackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpack_snorm4x8_to_float");
		break;
	case GLSLstd450UnpackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpack_unorm4x8_to_float");
		break;
	case GLSLstd450UnpackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpack_snorm2x16_to_float");
		break;
	case GLSLstd450UnpackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpack_unorm2x16_to_float");
		break;

	case GLSLstd450UnpackHalf2x16:
	{
		auto expr = join("float2(as_type<half2>(", to_expression(args[0]), "))");
		emit_op(result_type, id, expr, should_forward(args[0]));
		inherit_expression_dependencies(id, args[0]);
		break;
	}

	case GLSLstd450PackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "unsupported_GLSLstd450PackDouble2x32"); // Currently unsupported
		break;
	case GLSLstd450UnpackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "unsupported_GLSLstd450UnpackDouble2x32"); // Currently unsupported
		break;

	case GLSLstd450MatrixInverse:
	{
		auto &mat_type = get<SPIRType>(result_type);
		switch (mat_type.columns)
		{
		case 2:
			emit_unary_func_op(result_type, id, args[0], "spvInverse2x2");
			break;
		case 3:
			emit_unary_func_op(result_type, id, args[0], "spvInverse3x3");
			break;
		case 4:
			emit_unary_func_op(result_type, id, args[0], "spvInverse4x4");
			break;
		default:
			break;
		}
		break;
	}

	case GLSLstd450FMin:
		// If the result type isn't float, don't bother calling the specific
		// precise::/fast:: version. Metal doesn't have those for half and
		// double types.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "min");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "fast::min");
		break;

	case GLSLstd450FMax:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "max");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "fast::max");
		break;

	case GLSLstd450FClamp:
		// TODO: If args[1] is 0 and args[2] is 1, emit a saturate() call.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "clamp");
		else
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "fast::clamp");
		break;

	case GLSLstd450NMin:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "min");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::min");
		break;

	case GLSLstd450NMax:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "max");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::max");
		break;

	case GLSLstd450NClamp:
		// TODO: If args[1] is 0 and args[2] is 1, emit a saturate() call.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "clamp");
		else
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "precise::clamp");
		break;

		// TODO:
		//        GLSLstd450InterpolateAtCentroid (centroid_no_perspective qualifier)
		//        GLSLstd450InterpolateAtSample (sample_no_perspective qualifier)
		//        GLSLstd450InterpolateAtOffset

	case GLSLstd450Distance:
		// MSL does not support scalar versions here.
		if (expression_type(args[0]).vecsize == 1)
		{
			// Equivalent to length(a - b) -> abs(a - b).
			emit_op(result_type, id,
			        join("abs(", to_enclosed_unpacked_expression(args[0]), " - ",
			             to_enclosed_unpacked_expression(args[1]), ")"),
			        should_forward(args[0]) && should_forward(args[1]));
			inherit_expression_dependencies(id, args[0]);
			inherit_expression_dependencies(id, args[1]);
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Length:
		// MSL does not support scalar versions here.
		if (expression_type(args[0]).vecsize == 1)
		{
			// Equivalent to abs().
			emit_unary_func_op(result_type, id, args[0], "abs");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Normalize:
		// MSL does not support scalar versions here.
		if (expression_type(args[0]).vecsize == 1)
		{
			// Returns -1 or 1 for valid input, sign() does the job.
			emit_unary_func_op(result_type, id, args[0], "sign");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Reflect:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_binary_func_op(result_type, id, args[0], args[1], "spvReflect");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Refract:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvRefract");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450FaceForward:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvFaceForward");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Modf:
	case GLSLstd450Frexp:
	{
		// Special case. If the variable is a scalar access chain, we cannot use it directly. We have to emit a temporary.
		auto *ptr = maybe_get<SPIRExpression>(args[1]);
		if (ptr && ptr->access_chain && is_scalar(expression_type(args[1])))
		{
			register_call_out_argument(args[1]);
			forced_temporaries.insert(id);

			// Need to create temporaries and copy over to access chain after.
			// We cannot directly take the reference of a vector swizzle in MSL, even if it's scalar ...
			uint32_t &tmp_id = extra_sub_expressions[id];
			if (!tmp_id)
				tmp_id = ir.increase_bound_by(1);

			uint32_t tmp_type_id = get_pointee_type_id(ptr->expression_type);
			emit_uninitialized_temporary_expression(tmp_type_id, tmp_id);
			emit_binary_func_op(result_type, id, args[0], tmp_id, eop == GLSLstd450Modf ? "modf" : "frexp");
			statement(to_expression(args[1]), " = ", to_expression(tmp_id), ";");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}

	default:
		CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}
}